

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O0

void __thiscall cmGhsMultiTargetGenerator::GenerateTarget(cmGhsMultiTargetGenerator *this)

{
  cmTarget *pcVar1;
  string *str;
  char *value;
  cmGlobalGhsMultiGenerator *this_00;
  undefined1 local_3a0 [8];
  string language;
  cmGeneratedFileStream fout;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  char local_b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  cmAlphaNum local_90;
  cmAlphaNum local_60;
  undefined1 local_30 [8];
  string fproj;
  cmGhsMultiTargetGenerator *this_local;
  
  fproj.field_2._8_8_ = this;
  str = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                  (&this->LocalGenerator->super_cmLocalGenerator);
  cmAlphaNum::cmAlphaNum(&local_60,str);
  cmAlphaNum::cmAlphaNum(&local_90,'/');
  (*(this->LocalGenerator->super_cmLocalGenerator)._vptr_cmLocalGenerator[0xe])
            (&local_b0,this->LocalGenerator,this->GeneratorTarget);
  local_b1 = '/';
  cmStrCat<std::__cxx11::string,char,std::__cxx11::string,char_const*>
            ((string *)local_30,&local_60,&local_90,&local_b0,&local_b1,&this->Name,
             &cmGlobalGhsMultiGenerator::FILE_EXTENSION);
  std::__cxx11::string::~string((string *)&local_b0);
  pcVar1 = this->GeneratorTarget->Target;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"GENERATOR_FILE_NAME",&local_e9);
  cmTarget::SetProperty(pcVar1,&local_e8,(string *)local_30);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  pcVar1 = this->GeneratorTarget->Target;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"GENERATOR_FILE_NAME_EXT",(allocator<char> *)&fout.field_0x267);
  value = GhsMultiGpj::GetGpjTag(this->TagType);
  cmTarget::SetProperty(pcVar1,&local_110,value);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator((allocator<char> *)&fout.field_0x267);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)((long)&language.field_2 + 8),(string *)local_30,false,None);
  cmGeneratedFileStream::SetCopyIfDifferent
            ((cmGeneratedFileStream *)((long)&language.field_2 + 8),true);
  this_00 = GetGlobalGenerator(this);
  cmGlobalGhsMultiGenerator::WriteFileHeader(this_00,(ostream *)((long)&language.field_2 + 8));
  GhsMultiGpj::WriteGpjTag(this->TagType,(ostream *)((long)&language.field_2 + 8));
  if (this->TagType != CUSTOM_TARGET) {
    cmGeneratorTarget::GetLinkerLanguage
              ((string *)local_3a0,this->GeneratorTarget,&this->ConfigName);
    WriteTargetSpecifics(this,(ostream *)((long)&language.field_2 + 8),&this->ConfigName);
    SetCompilerFlags(this,&this->ConfigName,(string *)local_3a0);
    WriteCompilerFlags(this,(ostream *)((long)&language.field_2 + 8),&this->ConfigName,
                       (string *)local_3a0);
    WriteCompilerDefinitions
              (this,(ostream *)((long)&language.field_2 + 8),&this->ConfigName,(string *)local_3a0);
    WriteIncludes(this,(ostream *)((long)&language.field_2 + 8),&this->ConfigName,
                  (string *)local_3a0);
    WriteTargetLinkLine(this,(ostream *)((long)&language.field_2 + 8),&this->ConfigName);
    WriteBuildEvents(this,(ostream *)((long)&language.field_2 + 8));
    std::__cxx11::string::~string((string *)local_3a0);
  }
  WriteSources(this,(ostream *)((long)&language.field_2 + 8));
  cmGeneratedFileStream::Close((cmGeneratedFileStream *)((long)&language.field_2 + 8));
  cmGeneratedFileStream::~cmGeneratedFileStream
            ((cmGeneratedFileStream *)((long)&language.field_2 + 8));
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void cmGhsMultiTargetGenerator::GenerateTarget()
{
  // Open the target file in copy-if-different mode.
  std::string fproj =
    cmStrCat(this->LocalGenerator->GetCurrentBinaryDirectory(), '/',
             this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget),
             '/', this->Name, cmGlobalGhsMultiGenerator::FILE_EXTENSION);

  // Tell the global generator the name of the project file
  this->GeneratorTarget->Target->SetProperty("GENERATOR_FILE_NAME", fproj);
  this->GeneratorTarget->Target->SetProperty(
    "GENERATOR_FILE_NAME_EXT", GhsMultiGpj::GetGpjTag(this->TagType));

  cmGeneratedFileStream fout(fproj);
  fout.SetCopyIfDifferent(true);

  this->GetGlobalGenerator()->WriteFileHeader(fout);
  GhsMultiGpj::WriteGpjTag(this->TagType, fout);

  if (this->TagType != GhsMultiGpj::CUSTOM_TARGET) {
    const std::string language(
      this->GeneratorTarget->GetLinkerLanguage(this->ConfigName));
    this->WriteTargetSpecifics(fout, this->ConfigName);
    this->SetCompilerFlags(this->ConfigName, language);
    this->WriteCompilerFlags(fout, this->ConfigName, language);
    this->WriteCompilerDefinitions(fout, this->ConfigName, language);
    this->WriteIncludes(fout, this->ConfigName, language);
    this->WriteTargetLinkLine(fout, this->ConfigName);
    this->WriteBuildEvents(fout);
  }
  this->WriteSources(fout);
  fout.Close();
}